

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O0

BOOL is_word_char(uint32_t c)

{
  undefined1 local_5;
  uint32_t c_local;
  
  if ((((c < 0x30) || (local_5 = true, 0x39 < c)) && ((c < 0x61 || (local_5 = true, 0x7a < c)))) &&
     ((c < 0x41 || (local_5 = true, 0x5a < c)))) {
    local_5 = c == 0x5f;
  }
  return (BOOL)local_5;
}

Assistant:

static BOOL is_word_char(uint32_t c)
{
    return ((c >= '0' && c <= '9') ||
            (c >= 'a' && c <= 'z') ||
            (c >= 'A' && c <= 'Z') ||
            (c == '_'));
}